

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# strstr.c
# Opt level: O0

char * strstr(char *__haystack,char *__needle)

{
  bool bVar1;
  char *local_30;
  char *p2;
  char *p1;
  char *s2_local;
  char *s1_local;
  
  s2_local = __haystack;
  while( true ) {
    local_30 = __needle;
    p2 = s2_local;
    if (*s2_local == '\0') {
      return (char *)0x0;
    }
    while( true ) {
      bVar1 = false;
      if (*local_30 != '\0') {
        bVar1 = *p2 == *local_30;
      }
      if (!bVar1) break;
      p2 = p2 + 1;
      local_30 = local_30 + 1;
    }
    if (*local_30 == '\0') break;
    s2_local = s2_local + 1;
  }
  return s2_local;
}

Assistant:

char * strstr( const char * s1, const char * s2 )
{
    const char * p1 = s1;
    const char * p2;

    while ( *s1 )
    {
        p2 = s2;

        while ( *p2 && ( *p1 == *p2 ) )
        {
            ++p1;
            ++p2;
        }

        if ( ! *p2 )
        {
            return ( char * ) s1;
        }

        ++s1;
        p1 = s1;
    }

    return NULL;
}